

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O3

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset,erule effrule)

{
  switch(effrule) {
  case pwc:
    computeDAGup<(TasGrid::RuleLocal::erule)0>(__return_storage_ptr__,mset);
    break;
  case localp:
    computeDAGup<(TasGrid::RuleLocal::erule)1>(__return_storage_ptr__,mset);
    break;
  case semilocalp:
    computeDAGup<(TasGrid::RuleLocal::erule)2>(__return_storage_ptr__,mset);
    break;
  case localp0:
    computeDAGup<(TasGrid::RuleLocal::erule)3>(__return_storage_ptr__,mset);
    break;
  default:
    computeDAGup<(TasGrid::RuleLocal::erule)4>(__return_storage_ptr__,mset);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset, RuleLocal::erule effrule) {
    switch(effrule) {
        case RuleLocal::erule::pwc:
            return computeDAGup<RuleLocal::erule::pwc>(mset);
        case RuleLocal::erule::localp:
            return computeDAGup<RuleLocal::erule::localp>(mset);
        case RuleLocal::erule::semilocalp:
            return computeDAGup<RuleLocal::erule::semilocalp>(mset);
        case RuleLocal::erule::localp0:
            return computeDAGup<RuleLocal::erule::localp0>(mset);
        default: // case RuleLocal::erule::localpb:
            return computeDAGup<RuleLocal::erule::localpb>(mset);
    };
}